

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_retention.pb.cc
# Opt level: O0

void proto2_unittest::OptionsMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  OptionsMessage **v1;
  OptionsMessage **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  OptionsMessage *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  OptionsMessage *from;
  OptionsMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (OptionsMessage *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (OptionsMessage *)to_msg;
  _this = (OptionsMessage *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::OptionsMessage_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::OptionsMessage*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::OptionsMessage_const*,proto2_unittest::OptionsMessage*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar3;
    if ((uVar1 & 7) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.plain_field_ = *(int32_t *)(absl_log_internal_check_op_result + 0x18)
        ;
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.runtime_retention_field_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x1c);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.source_retention_field_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x20);
      }
    }
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_retention.pb.cc"
             ,0x1f5,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void OptionsMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<OptionsMessage*>(&to_msg);
  auto& from = static_cast<const OptionsMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.OptionsMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.plain_field_ = from._impl_.plain_field_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.runtime_retention_field_ = from._impl_.runtime_retention_field_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.source_retention_field_ = from._impl_.source_retention_field_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}